

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O3

void __thiscall
chrono::ChBody::IntStateGetIncrement
          (ChBody *this,uint off_x,ChState *x_new,ChState *x,uint off_v,ChStateDelta *Dv)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  uint uVar4;
  ulong uVar5;
  char *__function;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ChVector<double> angle_axis;
  ChQuaternion<double> q_old;
  ChQuaternion<double> q_new;
  double *local_a0;
  double local_98;
  double local_90;
  ChState *local_88;
  ulong local_80;
  ulong local_70;
  ChQuaternion<double> local_68;
  ChQuaternion<double> local_48;
  
  uVar8 = (ulong)off_x;
  uVar6 = (x_new->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (((long)uVar6 <= (long)uVar8) ||
     (local_70 = (x->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
     (long)local_70 <= (long)uVar8)) {
LAB_00506bb1:
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                  "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                 );
  }
  uVar5 = (Dv->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if ((long)uVar5 <= (long)(ulong)off_v) {
LAB_00506bd0:
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  pdVar1 = (x_new->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  pdVar2 = (x->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  pdVar3 = (Dv->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  pdVar3[off_v] = pdVar1[uVar8] - pdVar2[uVar8];
  uVar8 = (ulong)(off_x + 1);
  if ((uVar6 <= uVar8) || (local_70 <= uVar8)) goto LAB_00506bb1;
  if (uVar5 <= off_v + 1) goto LAB_00506bd0;
  uVar7 = (ulong)(off_x + 2);
  pdVar3[off_v + 1] = pdVar1[uVar8] - pdVar2[uVar8];
  if ((uVar6 <= uVar7) || (local_70 <= uVar7)) goto LAB_00506bb1;
  if (uVar5 <= off_v + 2) goto LAB_00506bd0;
  uVar6 = (ulong)(off_x + 3);
  local_a0 = pdVar2 + uVar6;
  pdVar3[off_v + 2] = pdVar1[uVar7] - pdVar2[uVar7];
  local_98 = 1.97626258336499e-323;
  local_88 = x;
  if ((long)uVar6 <= (long)(local_70 - 4)) {
    local_80 = uVar6;
    ChQuaternion<double>::
    ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_68,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)&local_a0,(type *)0x0);
    local_a0 = (x_new->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               uVar6;
    local_70 = (x_new->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_98 = 1.97626258336499e-323;
    local_88 = x_new;
    if ((long)uVar6 <= (long)(local_70 - 4)) {
      local_80 = uVar6;
      ChQuaternion<double>::
      ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&local_48,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_a0,(type *)0x0);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_68.m_data[2];
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_48.m_data[0];
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_68.m_data[1];
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_68.m_data[0];
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_48.m_data[2];
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_48.m_data[1];
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_68.m_data[3];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_48.m_data[3];
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_48.m_data[0] * local_68.m_data[2];
      auVar19 = vfmsub231sd_fma(auVar22,auVar12,auVar15);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_48.m_data[0] * local_68.m_data[1];
      auVar20 = vfmsub231sd_fma(auVar20,auVar12,auVar18);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_48.m_data[0] * local_68.m_data[3];
      auVar22 = vfmsub231sd_fma(auVar23,auVar12,auVar11);
      auVar23 = vfnmadd231sd_fma(auVar19,auVar10,auVar18);
      auVar19 = vfmadd231sd_fma(auVar20,auVar10,auVar15);
      auVar20 = vfmadd231sd_fma(auVar22,auVar13,auVar18);
      auVar22 = vfmadd231sd_fma(auVar23,auVar16,auVar11);
      dVar21 = auVar22._0_8_;
      auVar22 = vfnmadd231sd_fma(auVar19,auVar13,auVar11);
      auVar20 = vfnmadd231sd_fma(auVar20,auVar16,auVar15);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar21 * dVar21;
      auVar19 = vfmadd231sd_fma(auVar19,auVar22,auVar22);
      auVar19 = vfmadd231sd_fma(auVar19,auVar20,auVar20);
      if (auVar19._0_8_ <= 1e-30) {
        dVar9 = 2.0;
      }
      else {
        auVar17._8_8_ = 0;
        auVar17._0_8_ = local_68.m_data[1] * local_48.m_data[1];
        auVar23 = vfmadd213sd_fma(auVar14,auVar12,auVar17);
        auVar23 = vfmadd213sd_fma(auVar15,auVar13,auVar23);
        auVar23 = vfmadd213sd_fma(auVar11,auVar10,auVar23);
        auVar19 = vsqrtsd_avx(auVar19,auVar19);
        dVar9 = atan2(auVar19._0_8_,auVar23._0_8_);
        dVar9 = (dVar9 + dVar9) / auVar19._0_8_;
      }
      local_90 = auVar20._0_8_ * dVar9;
      local_98 = dVar21 * dVar9;
      local_a0 = (double *)(auVar22._0_8_ * dVar9);
      uVar6 = (ulong)(off_v + 3);
      if ((long)uVar6 <=
          (Dv->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3) {
        pdVar2 = (Dv->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        uVar8 = 3;
        pdVar1 = pdVar2 + uVar6;
        if (((ulong)pdVar1 & 7) == 0) {
          uVar4 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
          if ((ulong)uVar4 < 3) {
            uVar8 = (ulong)uVar4;
          }
          if (uVar4 == 0) goto LAB_00506b79;
        }
        memcpy(pdVar1,&local_a0,(ulong)(uint)((int)uVar8 * 8));
LAB_00506b79:
        if ((uint)uVar8 < 3) {
          uVar5 = (ulong)((uint)uVar8 * 8);
          memcpy(pdVar2 + uVar6 + uVar8,(void *)((long)&local_a0 + uVar5),0x18 - uVar5);
        }
        return;
      }
      __function = 
      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
      goto LAB_00506c1b;
    }
  }
  local_98 = 1.97626258336499e-323;
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
  local_80 = uVar6;
LAB_00506c1b:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void ChBody::IntStateGetIncrement(const unsigned int off_x,  // offset in x state vector
                               const ChState& x_new,         // state vector, position part, incremented result
                               const ChState& x,             // state vector, initial position part
                               const unsigned int off_v,     // offset in v state vector
                               ChStateDelta& Dv     // state vector, increment
) {
    // POSITION:
    Dv(off_v) = x_new(off_x) - x(off_x);
    Dv(off_v + 1) = x_new(off_x + 1) - x(off_x + 1);
    Dv(off_v + 2) = x_new(off_x + 2) - x(off_x + 2);

    // ROTATION (quaternions): Dq_loc = q_old^-1 * q_new,
    //  because   q_new = Dq_abs * q_old   = q_old * Dq_loc
    ChQuaternion<> q_old(x.segment(off_x + 3, 4));
    ChQuaternion<> q_new(x_new.segment(off_x + 3, 4));
    ChQuaternion<> rel_q = q_old.GetConjugate() % q_new;
    Dv.segment(off_v + 3, 3) = rel_q.Q_to_Rotv().eigen();
}